

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

void __thiscall
Satyricon::SATSolver::remove_from_vect
          (SATSolver *this,
          vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_> *v,
          ClausePtr c)

{
  bool bVar1;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *this_00;
  ClausePtr pCVar2;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *paVar3;
  Watcher *i;
  iterator __end1;
  iterator __begin1;
  vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_> *__range1;
  ClausePtr c_local;
  vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_> *v_local;
  SATSolver *this_local;
  
  __end1 = std::
           vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
           begin(v);
  i = (Watcher *)
      std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
      end(v);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
                                *)&i);
    if (!bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                    ,0x246,
                    "void Satyricon::SATSolver::remove_from_vect(vector<Watcher> &, ClausePtr)");
    }
    this_00 = &__gnu_cxx::
               __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
               ::operator*(&__end1)->field_0;
    pCVar2 = Watcher::get_clause((Watcher *)this_00);
    if (pCVar2 == c) break;
    __gnu_cxx::
    __normal_iterator<Satyricon::SATSolver::Watcher_*,_std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>
    ::operator++(&__end1);
  }
  paVar3 = &std::
            vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
            back(v)->field_0;
  *this_00 = *paVar3;
  std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
  pop_back(v);
  return;
}

Assistant:

void SATSolver::remove_from_vect( vector<Watcher> &v, ClausePtr c ) {
    for ( auto &i : v ) {
        if ( i.get_clause() == c ) {
            i = v.back();
            v.pop_back();
            return;
        }
    }
    assert(false);
}